

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O1

Vec_Str_t *
Abc_NtkClpGiaOne2(Cnf_Dat_t *pCnf,Gia_Man_t *p,int iCo,int nCubeLim,int nBTLimit,int fCanon,
                 int fReverse,Vec_Int_t *vSupp,Vec_Int_t *vMap,int fVerbose,Vec_Int_t *vClass,
                 Vec_Wec_t *vSupps)

{
  int iVar1;
  Vec_Int_t *vNodes;
  int *piVar2;
  Vec_Int_t *p_00;
  sat_solver *pSat;
  Vec_Str_t *vSop;
  long lVar3;
  int level;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  long local_50;
  timespec local_48;
  Cnf_Dat_t *local_38;
  
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if ((iCo < 0) || (p->vCos->nSize <= iCo)) {
LAB_002a056d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = p->vCos->pArray[(uint)iCo];
  local_5c = nCubeLim;
  local_58 = nBTLimit;
  local_54 = fCanon;
  local_50 = lVar3;
  local_38 = pCnf;
  if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_002a058c:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  local_60 = iVar1;
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  piVar2 = (int *)malloc(400);
  vNodes->pArray = piVar2;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(400);
  p_00->pArray = piVar2;
  if (0 < vSupp->nSize) {
    lVar3 = 0;
    do {
      iVar1 = vSupp->pArray[lVar3];
      if (((long)iVar1 < 0) || (p->vCis->nSize <= iVar1)) goto LAB_002a056d;
      iVar1 = p->vCis->pArray[iVar1];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_002a058c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p_00,iVar1);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vSupp->nSize);
  }
  Gia_ManIncrementTravId(p);
  Gia_ManCollectAnds(p,&local_60,1,vNodes,(Vec_Int_t *)0x0);
  if (0 < vNodes->nSize) {
    pSat = Abc_NtkClpDeriveSatSolver
                     (local_38,local_60,p_00,vNodes,vMap,(sat_solver **)0x0,(sat_solver **)0x0,
                      (sat_solver **)0x0);
    iVar1 = local_54;
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    if (fVerbose != 0) {
      printf("Output %4d:  Supp = %4d. Cone =%6d.\n",(ulong)(uint)iCo,(ulong)(uint)vSupp->nSize,
             (ulong)(uint)vNodes->nSize);
    }
    vSop = Bmc_CollapseOne_int(pSat,vSupp->nSize,local_5c,local_58,iVar1,fReverse,fVerbose);
    sat_solver_delete(pSat);
    if (vNodes->pArray != (int *)0x0) {
      free(vNodes->pArray);
      vNodes->pArray = (int *)0x0;
    }
    free(vNodes);
    if (vSop == (Vec_Str_t *)0x0) {
      vSop = (Vec_Str_t *)0x0;
    }
    else {
      Abc_NtkCollapseReduce(vSop,vSupp,vClass,vSupps);
      if (fVerbose != 0) {
        printf("Supp new = %4d. Sop = %4d.  ",(ulong)(uint)vSupp->nSize,
               (long)vSop->nSize / (long)(int)(vSupp->nSize + 3) & 0xffffffff);
        level = 3;
        iVar1 = clock_gettime(3,&local_48);
        if (iVar1 < 0) {
          lVar3 = -1;
        }
        else {
          lVar3 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
        }
        lVar3 = lVar3 + local_50;
        Abc_Print(level,"%s =","Time");
        Abc_Print(level,"%9.2f sec\n",(double)lVar3 / 1000000.0);
      }
    }
    return vSop;
  }
  __assert_fail("Vec_IntSize(vAnds) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                ,0x2fb,
                "Vec_Str_t *Abc_NtkClpGiaOne2(Cnf_Dat_t *, Gia_Man_t *, int, int, int, int, int, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Wec_t *)"
               );
}

Assistant:

Vec_Str_t * Abc_NtkClpGiaOne2( Cnf_Dat_t * pCnf, Gia_Man_t * p, int iCo, int nCubeLim, int nBTLimit, int fCanon, int fReverse, Vec_Int_t * vSupp, Vec_Int_t * vMap, int fVerbose, Vec_Int_t * vClass, Vec_Wec_t * vSupps )
{
    Vec_Str_t * vSop;
    sat_solver * pSat, * pSat1 = NULL, * pSat2 = NULL, * pSat3 = NULL;
    Gia_Obj_t * pObj;
    abctime clk = Abc_Clock();
    extern Vec_Str_t * Bmc_CollapseOne_int( sat_solver * pSat, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    extern Vec_Str_t * Bmc_CollapseOne_int2( sat_solver * pSat, sat_solver * pSat2, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    extern Vec_Str_t * Bmc_CollapseOne_int3( sat_solver * pSat, sat_solver * pSat1, sat_solver * pSat2, sat_solver * pSat3, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    int i, iCoObjId = Gia_ObjId( p, Gia_ManCo(p, iCo) );
    Vec_Int_t * vAnds = Vec_IntAlloc( 100 );
    Vec_Int_t * vSuppObjs = Vec_IntAlloc( 100 );
    Gia_ManForEachCiVec( vSupp, p, pObj, i )
        Vec_IntPush( vSuppObjs, Gia_ObjId(p, pObj) );
    Gia_ManIncrementTravId( p );
    Gia_ManCollectAnds( p, &iCoObjId, 1, vAnds, NULL );
    assert( Vec_IntSize(vAnds) > 0 );
//    pSat = Abc_NtkClpDeriveSatSolver( pCnf, iCoObjId, vSuppObjs, vAnds, vMap, &pSat1, &pSat2, &pSat3 );
    pSat = Abc_NtkClpDeriveSatSolver( pCnf, iCoObjId, vSuppObjs, vAnds, vMap, NULL, NULL, NULL );
    Vec_IntFree( vSuppObjs );
    if ( fVerbose )
        printf( "Output %4d:  Supp = %4d. Cone =%6d.\n", iCo, Vec_IntSize(vSupp), Vec_IntSize(vAnds) );
//    vSop = Bmc_CollapseOne_int3( pSat, pSat1, pSat2, pSat3, Vec_IntSize(vSupp), nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
//    vSop = Bmc_CollapseOne_int2( pSat, pSat1, Vec_IntSize(vSupp), nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
    vSop = Bmc_CollapseOne_int( pSat, Vec_IntSize(vSupp), nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
    sat_solver_delete( pSat );
    if ( pSat1 ) sat_solver_delete( pSat1 );
    if ( pSat2 ) sat_solver_delete( pSat2 );
    if ( pSat3 ) sat_solver_delete( pSat3 );
    Vec_IntFree( vAnds );
    if ( vSop == NULL )
        return NULL;
    Abc_NtkCollapseReduce( vSop, vSupp, vClass, vSupps );
    if ( fVerbose )
        printf( "Supp new = %4d. Sop = %4d.  ", Vec_IntSize(vSupp), Vec_StrSize(vSop)/(Vec_IntSize(vSupp) +3) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vSop; 
}